

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

size_t ALIGN_UP(size_t val,size_t alignment)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  
  if ((alignment & alignment - 1) == 0) {
    uVar2 = -alignment & (val + alignment) - 1;
    if (val <= uVar2) {
      return uVar2;
    }
    pcVar3 = "result >= val";
    uVar1 = 0x28;
  }
  else {
    pcVar3 = "0 == (alignment & (alignment - 1))";
    uVar1 = 0x26;
  }
  fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/include/pal/utils.h"
          ,uVar1,pcVar3,"");
  fflush(_stderr);
  abort();
}

Assistant:

inline size_t ALIGN_UP(size_t val, size_t alignment)
{
    // alignment must be a power of 2 for this implementation to work (need modulo otherwise)
    _ASSERTE(0 == (alignment & (alignment - 1)));
    size_t result = (val + (alignment - 1)) & ~(alignment - 1);
    _ASSERTE(result >= val);      // check for overflow
    return result;
}